

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O1

void __thiscall ST::string::to_buffer(string *this,wchar_buffer *result)

{
  type local_50;
  
  utf8_to_wchar<wchar_t>(&local_50,(this->m_buffer).m_chars,(this->m_buffer).m_size,assume_valid);
  buffer<wchar_t>::operator=(result,&local_50);
  if ((0xb < local_50.m_size) && (local_50.m_chars != (wchar_t *)0x0)) {
    operator_delete__(local_50.m_chars);
  }
  return;
}

Assistant:

void to_buffer(wchar_buffer &result) const
        {
            result = to_wchar();
        }